

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::ModifyRepeatedExtensions<proto2_unittest::TestAllExtensions>
               (TestAllExtensions *message)

{
  MutableType pRVar1;
  MutableType pTVar2;
  MutableType pFVar3;
  MutableType pIVar4;
  allocator<char> local_31;
  string local_30;
  
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::repeated_int32_extension,1,0x1f5);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                      *)&proto2_unittest::repeated_int64_extension,1,0x1f6);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                      *)&proto2_unittest::repeated_uint32_extension,1,0x1f7);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                      *)&proto2_unittest::repeated_uint64_extension,1,0x1f8);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                      *)&proto2_unittest::repeated_sint32_extension,1,0x1f9);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                      *)&proto2_unittest::repeated_sint64_extension,1,0x1fa);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                      *)&proto2_unittest::repeated_fixed32_extension,1,0x1fb);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                      *)&proto2_unittest::repeated_fixed64_extension,1,0x1fc);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                      *)&proto2_unittest::repeated_sfixed32_extension,1,0x1fd);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                      *)proto2_unittest::repeated_sfixed64_extension,1,0x1fe);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                      *)&proto2_unittest::repeated_float_extension,1,511.0);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                      *)&proto2_unittest::repeated_double_extension,1,512.0);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                      *)&proto2_unittest::repeated_bool_extension,1,true);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"515",&local_31);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::repeated_string_extension,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"516",&local_31);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::repeated_bytes_extension,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pRVar1 = proto2_unittest::TestAllExtensions::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension>,(unsigned_char)10,false>
                     (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension>,_(unsigned_char)__n_,_false>
                               *)proto2_unittest::repeatedgroup_extension,1);
  (pRVar1->field_0)._impl_.a_ = 0x205;
  *(byte *)&pRVar1->field_0 = *(byte *)&pRVar1->field_0 | 1;
  pTVar2 = proto2_unittest::TestAllExtensions::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                     (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_nested_message_extension,1);
  (pTVar2->field_0)._impl_.bb_ = 0x206;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
  pFVar3 = proto2_unittest::TestAllExtensions::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessage>,(unsigned_char)11,false>
                     (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_foreign_message_extension,1);
  (pFVar3->field_0)._impl_.c_ = 0x207;
  *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 1;
  pIVar4 = proto2_unittest::TestAllExtensions::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessage>,(unsigned_char)11,false>
                     (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_import_message_extension,1);
  (pIVar4->field_0)._impl_.d_ = 0x208;
  *(byte *)&pIVar4->field_0 = *(byte *)&pIVar4->field_0 | 1;
  pTVar2 = proto2_unittest::TestAllExtensions::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,(unsigned_char)11,false>
                     (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypes_NestedMessage>,_(unsigned_char)__v_,_false>
                               *)proto2_unittest::repeated_lazy_message_extension,1);
  (pTVar2->field_0)._impl_.bb_ = 0x20f;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,(unsigned_char)14,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypes_NestedEnum>,_(unsigned_char)__x0e_,_false>
                      *)&proto2_unittest::repeated_nested_enum_extension,1,
             TestAllTypes_NestedEnum_FOO);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,(unsigned_char)14,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnum>,_(unsigned_char)__x0e_,_false>
                      *)&proto2_unittest::repeated_foreign_enum_extension,1,FOREIGN_FOO);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnum>,(unsigned_char)14,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnum>,_(unsigned_char)__x0e_,_false>
                      *)&proto2_unittest::repeated_import_enum_extension,1,IMPORT_FOO);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"524",&local_31);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::repeated_string_piece_extension,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"525",&local_31);
  proto2_unittest::TestAllExtensions::
  SetExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensions,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                      *)proto2_unittest::repeated_cord_extension,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void ModifyRepeatedExtensions(TestAllExtensions* message) {
  using Traits = TestUtilTraits<TestAllExtensions>;
  message->SetExtension(Traits::repeated_int32_extension, 1, 501);
  message->SetExtension(Traits::repeated_int64_extension, 1, 502);
  message->SetExtension(Traits::repeated_uint32_extension, 1, 503);
  message->SetExtension(Traits::repeated_uint64_extension, 1, 504);
  message->SetExtension(Traits::repeated_sint32_extension, 1, 505);
  message->SetExtension(Traits::repeated_sint64_extension, 1, 506);
  message->SetExtension(Traits::repeated_fixed32_extension, 1, 507);
  message->SetExtension(Traits::repeated_fixed64_extension, 1, 508);
  message->SetExtension(Traits::repeated_sfixed32_extension, 1, 509);
  message->SetExtension(Traits::repeated_sfixed64_extension, 1, 510);
  message->SetExtension(Traits::repeated_float_extension, 1, 511);
  message->SetExtension(Traits::repeated_double_extension, 1, 512);
  message->SetExtension(Traits::repeated_bool_extension, 1, true);
  message->SetExtension(Traits::repeated_string_extension, 1, "515");
  message->SetExtension(Traits::repeated_bytes_extension, 1, "516");

  message->MutableExtension(Traits::repeatedgroup_extension, 1)->set_a(517);
  message->MutableExtension(Traits::repeated_nested_message_extension, 1)
      ->set_bb(518);
  message->MutableExtension(Traits::repeated_foreign_message_extension, 1)
      ->set_c(519);
  message->MutableExtension(Traits::repeated_import_message_extension, 1)
      ->set_d(520);
  message->MutableExtension(Traits::repeated_lazy_message_extension, 1)
      ->set_bb(527);

  message->SetExtension(Traits::repeated_nested_enum_extension, 1,
                        Traits::TestAllTypes::FOO);
  message->SetExtension(Traits::repeated_foreign_enum_extension, 1,
                        Traits::FOREIGN_FOO);
  message->SetExtension(Traits::repeated_import_enum_extension, 1,
                        Traits::IMPORT_FOO);

  message->SetExtension(Traits::repeated_string_piece_extension, 1, "524");
  message->SetExtension(Traits::repeated_cord_extension, 1, "525");
}